

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

string * __thiscall
PhyloTree::getNewick_abi_cxx11_(string *__return_storage_ptr__,PhyloTree *this,bool branchLengths)

{
  pointer pcVar1;
  double d;
  undefined8 uVar2;
  PhyloTree *pPVar3;
  pointer pPVar4;
  bool bVar5;
  _Elt_pointer pbVar6;
  _Elt_pointer pPVar7;
  long *plVar8;
  undefined8 *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  pointer pbVar12;
  size_t sVar13;
  int __flags;
  size_type *in_RCX;
  size_type *psVar14;
  _func_int **pp_Var15;
  undefined7 in_register_00000011;
  void *__child_stack;
  ulong uVar16;
  string *psVar17;
  ulong uVar18;
  PhyloTreeEdge *other;
  pointer pbVar19;
  Tools *pTVar20;
  void *in_R8;
  size_t i;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string str1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesLeft;
  Bipartition allLeaves;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> corrEdges;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strPieces;
  string local_298;
  string *local_278;
  undefined4 local_26c;
  PhyloTree *local_268;
  undefined1 local_260 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_210;
  string local_1f8;
  PhyloTreeEdge local_1d8;
  _func_int **local_190;
  _Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_188;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_e0;
  string local_c0;
  string local_a0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  
  local_26c = (undefined4)CONCAT71(in_register_00000011,branchLengths);
  local_138._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_138,0);
  local_188._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_initialize_map(&local_188,0);
  local_278 = __return_storage_ptr__;
  local_268 = this;
  if ((this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (char (*) [2])0x195654);
    pbVar19 = (this->leaf2NumMap).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (this->leaf2NumMap).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pbVar12 - (long)pbVar19 != 0x20) {
      lVar23 = 0;
      uVar21 = 0;
      do {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_138,(value_type *)((long)&(pbVar19->_M_dataplus)._M_p + lVar23));
        if ((char)local_26c != '\0') {
          pTVar20 = (Tools *)0x194f62;
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[2]>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                     (char (*) [2])0x194f62);
          Tools::double_to_string_abi_cxx11_
                    ((string *)&local_1d8,pTVar20,
                     (local_268->leafEdgeLengths).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21]);
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                    );
          if (local_1d8.super_Bipartition._vptr_Bipartition !=
              (_func_int **)
              ((long)&local_1d8.super_Bipartition.partition.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8U
              )) {
            operator_delete(local_1d8.super_Bipartition._vptr_Bipartition);
          }
        }
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                   (char (*) [2])0x195565);
        uVar21 = uVar21 + 1;
        pbVar19 = (local_268->leaf2NumMap).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar12 = (local_268->leaf2NumMap).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar23 = lVar23 + 0x20;
      } while (uVar21 < ((long)pbVar12 - (long)pbVar19 >> 5) - 1U);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_138,pbVar12 + -1);
    pPVar3 = local_268;
    pTVar20 = (Tools *)0x194f62;
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (char (*) [2])0x194f62);
    Tools::double_to_string_abi_cxx11_
              ((string *)&local_1d8,pTVar20,
               (pPVar3->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
    if (local_1d8.super_Bipartition._vptr_Bipartition !=
        (_func_int **)
        ((long)&local_1d8.super_Bipartition.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8U)) {
      operator_delete(local_1d8.super_Bipartition._vptr_Bipartition);
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (char (*) [3])0x19601c);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::deque(&local_80,
            (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_138);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    Tools::string_join(local_278,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(&local_80);
    psVar17 = local_278;
  }
  else {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_210,&this->edges);
    if (local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&PTR_toString_abi_cxx11__001bbe70;
      local_190 = (_func_int **)&PTR_toString_abi_cxx11__001bbd78;
      do {
        PhyloTreeEdge::PhyloTreeEdge
                  (&local_1d8,
                   local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        __flags = (int)in_RCX;
        if ((ulong)(((long)local_210.
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_210.
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2) {
          uVar21 = 0;
        }
        else {
          uVar16 = 1;
          lVar23 = 0x48;
          uVar21 = 0;
          do {
            bVar5 = Bipartition::contains
                              (&local_1d8.super_Bipartition,
                               (Bipartition *)
                               ((long)&((local_210.
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar23));
            pPVar4 = local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (bVar5) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (&local_1d8.super_Bipartition.partition.m_bits,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ((long)&((local_210.
                                   super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                                 partition.m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar23));
              local_1d8.super_Bipartition.partition.m_num_bits =
                   *(size_type *)((long)&(pPVar4->super_Bipartition).partition.m_num_bits + lVar23);
              local_1d8.length = *(double *)((long)&pPVar4->length + lVar23);
              local_1d8.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = *(element_type **)
                        ((long)&(pPVar4->originalEdge).
                                super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                        lVar23);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_1d8.originalEdge.
                          super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(pPVar4->originalEdge).
                                 super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + lVar23));
              local_1d8.originalID = *(int *)((long)&pPVar4->originalID + lVar23);
              uVar21 = uVar16;
            }
            __flags = (int)in_RCX;
            uVar16 = uVar16 + 1;
            lVar23 = lVar23 + 0x48;
          } while (uVar16 < (ulong)(((long)local_210.
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_210.
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x71c71c71c71c71c7));
        }
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase
                  (&local_210,
                   local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar21);
        PhyloTreeEdge::clone
                  ((PhyloTreeEdge *)local_260,(__fn *)&local_1d8,__child_stack,__flags,in_R8);
        __return_storage_ptr__ = local_278;
        std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_front<PhyloTreeEdge>
                  ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        local_260._0_8_ = local_218;
        if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
        }
        local_260._0_8_ = local_190;
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (local_260 + 8));
        if (!bVar5) goto LAB_00146de2;
        if ((pointer)local_260._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_260._8_8_);
        }
        local_260._0_8_ = local_260 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_front<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_);
        }
        local_260._0_8_ = local_260 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"(","");
        uVar21 = 1;
        while (uVar21 < ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                        -0x71c71c71c71c71c7 +
                        ((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                        -0x71c71c71c71c71c7 +
                        (((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_188._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1
                        + (ulong)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                 (_Map_pointer)0x0)) * 7) {
          uVar16 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
                   -0x71c71c71c71c71c7 + uVar21;
          if ((long)uVar16 < 0) {
            uVar18 = ~(~uVar16 / 7);
LAB_00146153:
            pPVar7 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] + uVar18 * -7
            ;
            uVar18 = uVar16;
          }
          else {
            pPVar7 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar18 = uVar21;
            if (6 < uVar16) {
              uVar18 = uVar16 / 7;
              goto LAB_00146153;
            }
          }
          bVar5 = Bipartition::contains
                            (&local_1d8.super_Bipartition,&pPVar7[uVar18].super_Bipartition);
          if (bVar5) {
            uVar16 = ((long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_138._M_impl.super__Deque_impl_data._M_start._M_first >> 5) +
                     uVar21;
            if ((long)uVar16 < 0) {
              uVar18 = (long)uVar16 >> 4;
LAB_001461bf:
              pbVar6 = local_138._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                       uVar16 + uVar18 * -0x10;
            }
            else {
              if (0xf < uVar16) {
                uVar18 = uVar16 >> 4;
                goto LAB_001461bf;
              }
              pbVar6 = local_138._M_impl.super__Deque_impl_data._M_start._M_cur + uVar21;
            }
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            pcVar1 = (pbVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,pcVar1,pcVar1 + pbVar6->_M_string_length);
            std::__cxx11::string::append((char *)&local_298);
            std::__cxx11::string::_M_append((char *)local_260,(ulong)local_298._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            uVar16 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
                     -0x71c71c71c71c71c7 + uVar21;
            if ((long)uVar16 < 0) {
              uVar18 = ~(~uVar16 / 7);
LAB_0014629b:
              pPVar7 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                       uVar18 * -7;
              uVar18 = uVar16;
            }
            else {
              pPVar7 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar18 = uVar21;
              if (6 < uVar16) {
                uVar18 = uVar16 / 7;
                goto LAB_0014629b;
              }
            }
            Bipartition::andNot(&local_1d8.super_Bipartition,&pPVar7[uVar18].super_Bipartition);
            Tools::deque_remove_element_at_index<std::__cxx11::string>
                      ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_138,uVar21);
            Tools::deque_remove_element_at_index<PhyloTreeEdge>
                      ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_188,uVar21);
          }
          else {
            uVar21 = uVar21 + 1;
          }
        }
        Bipartition::getPartition
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                   &local_1d8.super_Bipartition);
        uVar2 = local_298.field_2._8_8_;
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_298);
        if (!bVar5) goto LAB_00146de2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if (uVar2 != 0) {
          lVar23 = 8;
          uVar21 = 0;
          while( true ) {
            Bipartition::getPartition
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                       &local_1d8.super_Bipartition);
            uVar2 = local_298.field_2._8_8_;
            bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                        *)&local_298);
            if (!bVar5) goto LAB_00146de2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            __return_storage_ptr__ = local_278;
            if ((ulong)uVar2 <= uVar21) break;
            Bipartition::getPartition
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                       &local_1d8.super_Bipartition);
            uVar16 = *(ulong *)(local_298._M_dataplus._M_p + (uVar21 >> 6) * 8);
            bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                        *)&local_298);
            if (!bVar5) goto LAB_00146de2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            if ((1L << ((byte)uVar21 & 0x3f) & uVar16) != 0) {
              pTVar20 = *(Tools **)
                         ((long)(local_268->leaf2NumMap).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8);
              std::__cxx11::string::_M_append(local_260,(ulong)pTVar20);
              if ((char)local_26c != '\0') {
                Tools::double_to_string_abi_cxx11_
                          (&local_1f8,pTVar20,
                           (local_268->leafEdgeLengths).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar21]);
                in_R8 = (void *)0x1;
                plVar8 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1f8,0,(char *)0x0,0x194f62);
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                psVar14 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_298.field_2._M_allocated_capacity = *psVar14;
                  local_298.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_298.field_2._M_allocated_capacity = *psVar14;
                  local_298._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_298._M_string_length = plVar8[1];
                *plVar8 = (long)psVar14;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append(local_260,(ulong)local_298._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p);
                }
              }
              std::__cxx11::string::append(local_260);
            }
            uVar21 = uVar21 + 1;
            lVar23 = lVar23 + 0x20;
          }
        }
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_260._0_8_,(pointer)(local_260._8_8_ + local_260._0_8_))
        ;
        Tools::substring(&local_1f8,&local_e0,0,local_260._8_8_ - 1);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
        in_RCX = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_RCX) {
          local_298.field_2._M_allocated_capacity = *in_RCX;
          local_298.field_2._8_8_ = puVar9[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *in_RCX;
          local_298._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_298._M_string_length = puVar9[1];
        *puVar9 = in_RCX;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        psVar17 = &local_298;
        std::__cxx11::string::operator=((string *)local_260,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((char)local_26c != '\0') {
          d = PhyloTreeEdge::getLength(&local_1d8);
          Tools::double_to_string_abi_cxx11_(&local_1f8,(Tools *)psVar17,d);
          in_R8 = (void *)0x1;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x194f62);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          in_RCX = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_RCX) {
            local_298.field_2._M_allocated_capacity = *in_RCX;
            local_298.field_2._8_8_ = puVar9[3];
          }
          else {
            local_298.field_2._M_allocated_capacity = *in_RCX;
            local_298._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_298._M_string_length = puVar9[1];
          *puVar9 = in_RCX;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_260,(ulong)local_298._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_138,(value_type *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_);
        }
        local_1d8.super_Bipartition._vptr_Bipartition = (_func_int **)local_218;
        if (local_1d8.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d8.originalEdge.
                     super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        local_1d8.super_Bipartition._vptr_Bipartition = local_190;
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_1d8.super_Bipartition.partition);
        if (!bVar5) goto LAB_00146de2;
        if (local_1d8.super_Bipartition.partition.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d8.super_Bipartition.partition.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      } while (local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_260,
               (char)((long)(local_268->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_268->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5));
    Bipartition::Bipartition(&local_1d8.super_Bipartition,(string *)local_260);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_);
    }
    local_218 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    lVar23 = -1;
    lVar22 = 0;
    lVar24 = 0;
    for (uVar21 = 0;
        uVar21 < ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                 -0x71c71c71c71c71c7 +
                 ((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                 -0x71c71c71c71c71c7 +
                 (((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_188._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 7; uVar21 = uVar21 + 1) {
      uVar16 = ((long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_138._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + uVar21;
      if ((long)uVar16 < 0) {
        uVar18 = (long)uVar16 >> 4;
LAB_0014681c:
        pbVar10 = local_138._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                  uVar16 + uVar18 * -0x10;
      }
      else {
        if (0xf < uVar16) {
          uVar18 = uVar16 >> 4;
          goto LAB_0014681c;
        }
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&((local_138._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus).
                          _M_p + lVar24);
      }
      local_260._0_8_ = local_260 + 0x10;
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_260,pcVar1,pcVar1 + pbVar10->_M_string_length);
      std::__cxx11::string::append((char *)local_260);
      std::__cxx11::string::_M_append((char *)local_278,local_260._0_8_);
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_);
      }
      lVar11 = (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
      uVar16 = uVar21 + lVar11 * -0x71c71c71c71c71c7;
      if ((long)uVar16 < 0) {
        uVar18 = ~((ulong)(lVar23 + lVar11 * 0x71c71c71c71c71c7) / 7);
LAB_001468ff:
        other = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                uVar18 * -7 + uVar16;
      }
      else {
        if (6 < uVar16) {
          uVar18 = uVar16 / 7;
          goto LAB_001468ff;
        }
        other = (PhyloTreeEdge *)
                ((long)&((local_188._M_impl.super__Deque_impl_data._M_start._M_cur)->
                        super_Bipartition)._vptr_Bipartition + lVar22);
      }
      Bipartition::andNot(&local_1d8.super_Bipartition,&other->super_Bipartition);
      lVar24 = lVar24 + 0x20;
      lVar23 = lVar23 + -1;
      lVar22 = lVar22 + 0x48;
    }
    bVar5 = Bipartition::isEmpty(&local_1d8.super_Bipartition);
    if (!bVar5) {
      lVar23 = 8;
      for (uVar21 = 0; sVar13 = Bipartition::size(&local_1d8.super_Bipartition), uVar21 < sVar13;
          uVar21 = uVar21 + 1) {
        Bipartition::getPartition
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_260,
                   &local_1d8.super_Bipartition);
        uVar16 = *(ulong *)(local_260._0_8_ + (uVar21 >> 6) * 8);
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_260);
        if (!bVar5) goto LAB_00146de2;
        if ((_func_int **)local_260._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_260._0_8_);
        }
        if ((1L << ((byte)uVar21 & 0x3f) & uVar16) != 0) {
          pTVar20 = *(Tools **)
                     ((long)(local_268->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8);
          std::__cxx11::string::_M_append((char *)local_278,(ulong)pTVar20);
          if ((char)local_26c != '\0') {
            Tools::double_to_string_abi_cxx11_
                      (&local_298,pTVar20,
                       (local_268->leafEdgeLengths).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21]);
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x194f62);
            local_260._0_8_ = local_260 + 0x10;
            pp_Var15 = (_func_int **)(puVar9 + 2);
            if ((_func_int **)*puVar9 == pp_Var15) {
              local_260._16_8_ = *pp_Var15;
              local_260._24_8_ = puVar9[3];
            }
            else {
              local_260._16_8_ = *pp_Var15;
              local_260._0_8_ = (_func_int **)*puVar9;
            }
            local_260._8_8_ = puVar9[1];
            *puVar9 = pp_Var15;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_278,local_260._0_8_);
            if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
              operator_delete((void *)local_260._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
          }
          std::__cxx11::string::append((char *)local_278);
        }
        lVar23 = lVar23 + 0x20;
      }
    }
    psVar17 = local_278;
    pcVar1 = (local_278->_M_dataplus)._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + local_278->_M_string_length);
    Tools::substring(&local_298,&local_c0,0,psVar17->_M_string_length - 1);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
    pp_Var15 = (_func_int **)(plVar8 + 2);
    if ((_func_int **)*plVar8 == pp_Var15) {
      local_260._16_8_ = *pp_Var15;
      local_260._24_8_ = plVar8[3];
      local_260._0_8_ = local_260 + 0x10;
    }
    else {
      local_260._16_8_ = *pp_Var15;
      local_260._0_8_ = (_func_int **)*plVar8;
    }
    local_260._8_8_ = plVar8[1];
    *plVar8 = (long)pp_Var15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_278,(string *)local_260);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_1d8.super_Bipartition._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001bbd78;
    bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_1d8.super_Bipartition.partition);
    psVar17 = local_278;
    if (!bVar5) {
LAB_00146de2:
      __assert_fail("m_check_invariants()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x279,
                    "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    if (local_1d8.super_Bipartition.partition.m_bits.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super_Bipartition.partition.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_210);
  }
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque
            ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_188);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_138);
  return psVar17;
}

Assistant:

string PhyloTree::getNewick(bool branchLengths) {
    deque<string> strPieces;
    deque<PhyloTreeEdge> corrEdges;

    if (edges.empty()) // star-tree
    {
        strPieces.emplace_back("(");
        for (size_t i = 0; i < leaf2NumMap.size() - 1; ++i) {
            strPieces.push_back(leaf2NumMap[i]);
            if (branchLengths) {
                strPieces.emplace_back(":");
                strPieces.push_back(Tools::double_to_string(leafEdgeLengths[i]));
            }
            strPieces.emplace_back(",");
        }
        strPieces.push_back(leaf2NumMap.back());
        strPieces.emplace_back(":");
        strPieces.push_back(Tools::double_to_string(leafEdgeLengths.back()));
        strPieces.emplace_back(");");
        return Tools::string_join(strPieces, "");
    }

    vector<PhyloTreeEdge> edgesLeft(edges);

    while (!edgesLeft.empty()) {
        auto minEdge = edgesLeft.front();
        size_t pos = 0;
        for (size_t i = 1; i < edgesLeft.size(); ++i) {
            if (minEdge.contains(edgesLeft[i])) {
                minEdge = edgesLeft[i];
                pos = i;
            }
        }
        Tools::vector_remove_element_at_index(edgesLeft, pos);

        corrEdges.push_front(minEdge.clone());
        strPieces.push_front("");

        // now we have a min element.
        // Start its Newick string.
        string str1 = "(";

        // Since we are allowing degenerate trees, there could be an arbitrary number of such edges.
        size_t k = 1;
        while (k < corrEdges.size()) {
            if (minEdge.contains(corrEdges[k])) {
                // add it to the string
                str1 += strPieces[k] + ",";

                // remove each leaf in this split from minEdge
                minEdge.andNot(corrEdges[k]);

                // remove this split and its corresponding string from the vectors
                Tools::deque_remove_element_at_index(strPieces, k);
                Tools::deque_remove_element_at_index(corrEdges, k);
            } else {
                k++;
            }
        }

        // add all the elements still in minEdge (These are leaves that weren't already added as part of
        // a min split contained by minEdge.)
        if (!minEdge.getPartition().empty()) {
            for (size_t i = 0; i < minEdge.getPartition().size(); i++) {
                if (minEdge.getPartition()[i]) {
                    str1 += leaf2NumMap[i];
                    if (branchLengths) {
                        str1 += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                    }
                    str1 += ",";
                }
            }
        }
        // remove the last , and add the bracket and minEdge length
        str1 = Tools::substring(str1, 0, str1.length() - 1) + ")";
        if (branchLengths) {
            str1 += ":" + Tools::double_to_string(minEdge.getLength());
        }
        // store str1
        strPieces.push_front(str1);
    }

    // now we need to combine all edges in corrEdges and all remaining leaves
    Bipartition allLeaves = Bipartition(string(leaf2NumMap.size(), '1'));

    string newickString = "(";
    // add all the string pieces we've accumulated
    for (int i = 0; i < corrEdges.size(); i++) {
        newickString += strPieces[i] + ",";
        allLeaves.andNot(corrEdges[i]);
    }
    // add all remaining leaves
    if (!allLeaves.isEmpty()) {
        for (size_t i = 0; i < allLeaves.size(); i++) {
            if ((allLeaves.getPartition())[i]) {
                newickString += leaf2NumMap[i];
                if (branchLengths) {
                    newickString += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                }
                newickString += ",";
            }
        }
    }

    // remove the last ,
    newickString = Tools::substring(newickString, 0, newickString.length() - 1) + ");";
    return newickString;
}